

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

void __thiscall BackwardPass::ProcessNewScObject(BackwardPass *this,Instr *instr)

{
  BasicBlock *pBVar1;
  Opnd *this_00;
  Func *this_01;
  code *pcVar2;
  JITTimeConstructorCache *this_02;
  bool bVar3;
  OpndKind OVar4;
  BOOLEAN BVar5;
  BailOutKind BVar6;
  undefined4 *puVar7;
  StackSym *objSym;
  RegOpnd *this_03;
  StackSym *this_04;
  ProfiledInstr *pPVar8;
  AddPropertyCacheBucket *data;
  ObjTypeGuardBucket *pOVar9;
  BVSparse<Memory::JitArenaAllocator> *pBVar10;
  JITTypeHolderBase<void> local_70;
  JITTypeHolderBase<void> local_68;
  JITTypeHolderBase<void> local_60;
  JITTypeHolderBase<void> local_58;
  JITTypeHolderBase<void> local_50;
  JITTypeHolderBase<void> local_48;
  JITTimeConstructorCache *local_40;
  BasicBlock *local_38;
  
  if ((((this->tag == DeadStorePhase) && (this->isCollectionPass == false)) &&
      ((instr->m_opcode == NewScObjectNoCtor || (instr->m_opcode == NewScObject)))) &&
     ((instr->field_0x38 & 0x10) != 0)) {
    BVar6 = IR::Instr::GetBailOutKindNoBits(instr);
    if (BVar6 != BailOutFailedCtorGuardCheck) {
      return;
    }
    if (instr->m_kind != InstrKindProfiled) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x131d,"(instr->IsProfiledInstr())","instr->IsProfiledInstr()");
      if (!bVar3) goto LAB_003de716;
      *puVar7 = 0;
    }
    OVar4 = IR::Opnd::GetKind(instr->m_dst);
    if (OVar4 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x131e,"(instr->GetDst()->IsRegOpnd())","instr->GetDst()->IsRegOpnd()");
      if (!bVar3) goto LAB_003de716;
      *puVar7 = 0;
    }
    pBVar1 = this->currentBlock;
    this_00 = instr->m_dst;
    OVar4 = IR::Opnd::GetKind(this_00);
    if (OVar4 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) goto LAB_003de716;
      *puVar7 = 0;
    }
    objSym = IR::Opnd::GetStackSym(this_00);
    BVar5 = BVSparse<Memory::JitArenaAllocator>::Test
                      (pBVar1->upwardExposedUses,(objSym->super_Sym).m_id);
    if (BVar5 == '\0') {
      IR::Instr::ClearBailOutInfo(instr);
      if (this->preOpBailOutInstrToProcess == instr) {
        this->preOpBailOutInstrToProcess = (Instr *)0x0;
      }
      if (pBVar1->stackSymToGuardedProperties ==
          (HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *)0x0) {
        return;
      }
      pOVar9 = HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator>::Get
                         (pBVar1->stackSymToGuardedProperties,(objSym->super_Sym).m_id);
      if (pOVar9 == (ObjTypeGuardBucket *)0x0) {
        return;
      }
      pBVar10 = pOVar9->guardedPropertyOps;
      do {
        pBVar10 = (BVSparse<Memory::JitArenaAllocator> *)pBVar10->head;
        if (pBVar10 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          return;
        }
      } while (((Type *)&pBVar10->alloc)->word == 0);
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x1369,"(bucket == nullptr || bucket->GetGuardedPropertyOps()->IsEmpty())"
                         ,"bucket == nullptr || bucket->GetGuardedPropertyOps()->IsEmpty()");
      if (bVar3) {
        *puVar7 = 0;
        return;
      }
LAB_003de716:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    this_03 = IR::Opnd::AsRegOpnd(instr->m_dst);
    this_04 = IR::Opnd::GetStackSym(&this_03->super_Opnd);
    bVar3 = StackSym::HasObjectTypeSym(this_04);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x1327,"(instr->GetDst()->AsRegOpnd()->GetStackSym()->HasObjectTypeSym())"
                         ,"instr->GetDst()->AsRegOpnd()->GetStackSym()->HasObjectTypeSym()");
      if (!bVar3) goto LAB_003de716;
      *puVar7 = 0;
    }
    this_01 = instr->m_func;
    pPVar8 = IR::Instr::AsProfiledInstr(instr);
    local_40 = Func::GetConstructorCache(this_01,(pPVar8->u).field_3.fldInfoData.f1);
    local_38 = pBVar1;
    if ((pBVar1->stackSymToFinalType !=
         (HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *)0x0) &&
       (data = HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator>::Get
                         (pBVar1->stackSymToFinalType,(objSym->super_Sym).m_id),
       data != (AddPropertyCacheBucket *)0x0)) {
      local_48.t = (data->initialType).t;
      local_50.t = (Type)0x0;
      bVar3 = JITTypeHolderBase<void>::operator!=(&local_48,&local_50.t);
      if (bVar3) {
        local_70.t = (data->finalType).t;
        local_68.t = (data->initialType).t;
        bVar3 = JITTypeHolderBase<void>::operator!=(&local_70,&local_68);
        if (bVar3) {
          local_48.t = (data->initialType).t;
          local_50.t = (Type)JITTimeConstructorCache::GetType(local_40);
          bVar3 = JITTypeHolderBase<void>::operator==(&local_48,&local_50);
          if (!bVar3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar7 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0x1334,"(pBucket->GetInitialType() == ctorCache->GetType())",
                               "pBucket->GetInitialType() == ctorCache->GetType()");
            if (!bVar3) goto LAB_003de716;
            *puVar7 = 0;
          }
          if (this->currentPrePassLoop == (Loop *)0x0) {
            InsertTypeTransition(this,instr->m_next,objSym,data,local_38->upwardExposedUses);
          }
          (data->deadStoreUnavailableInitialType).t = (data->initialType).t;
          local_48.t = (Type)0x0;
          bVar3 = JITTypeHolderBase<void>::operator==
                            (&data->deadStoreUnavailableFinalType,&local_48.t);
          if (bVar3) {
            (data->deadStoreUnavailableFinalType).t = (data->finalType).t;
          }
          JITTypeHolderBase<void>::JITTypeHolderBase(&local_60,(JITType *)0x0);
          (data->initialType).t = local_60.t;
          JITTypeHolderBase<void>::JITTypeHolderBase(&local_58,(JITType *)0x0);
          (data->finalType).t = local_58.t;
          if (local_38->typeIDsWithFinalType != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
            BVSparse<Memory::JitArenaAllocator>::Clear
                      (local_38->typeIDsWithFinalType,(objSym->super_Sym).m_id);
          }
        }
      }
    }
    if (((local_38->stackSymToGuardedProperties !=
          (HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *)0x0) &&
        (pOVar9 = HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator>::Get
                            (local_38->stackSymToGuardedProperties,(objSym->super_Sym).m_id),
        this_02 = local_40, pOVar9 != (ObjTypeGuardBucket *)0x0)) &&
       (pBVar10 = pOVar9->guardedPropertyOps, pBVar10 != (BVSparse<Memory::JitArenaAllocator> *)0x0)
       ) {
      JITTimeConstructorCache::EnsureGuardedPropOps(local_40,this->func->m_alloc);
      JITTimeConstructorCache::AddGuardedPropOps(this_02,pBVar10);
      pOVar9->guardedPropertyOps = (BVSparse<Memory::JitArenaAllocator> *)0x0;
      Memory::
      DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                (this->tempAlloc,pBVar10);
      HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator>::Clear
                (local_38->stackSymToGuardedProperties,(objSym->super_Sym).m_id);
    }
  }
  return;
}

Assistant:

void
BackwardPass::ProcessNewScObject(IR::Instr* instr)
{
    if (this->tag != Js::DeadStorePhase || IsCollectionPass())
    {
        return;
    }

    if (!instr->IsNewScObjectInstr())
    {
        return;
    }

    // The instruction could have a lazy bailout associated with it, which might get cleared
    // later, so we make sure that we only process instructions with the right bailout kind.
    if (instr->HasBailOutInfo() && instr->GetBailOutKindNoBits() == IR::BailOutFailedCtorGuardCheck)
    {
        Assert(instr->IsProfiledInstr());
        Assert(instr->GetDst()->IsRegOpnd());

        BasicBlock * block = this->currentBlock;
        StackSym* objSym = instr->GetDst()->AsRegOpnd()->GetStackSym();

        if (block->upwardExposedUses->Test(objSym->m_id))
        {
            // If the object created here is used downstream, let's capture any property operations we must protect.

            Assert(instr->GetDst()->AsRegOpnd()->GetStackSym()->HasObjectTypeSym());

            JITTimeConstructorCache* ctorCache = instr->m_func->GetConstructorCache(static_cast<Js::ProfileId>(instr->AsProfiledInstr()->u.profileId));

            if (block->stackSymToFinalType != nullptr)
            {
                // NewScObject is the origin of the object pointer. If we have a final type in hand, do the
                // transition here.
                AddPropertyCacheBucket *pBucket = block->stackSymToFinalType->Get(objSym->m_id);
                if (pBucket &&
                    pBucket->GetInitialType() != nullptr &&
                    pBucket->GetFinalType() != pBucket->GetInitialType())
                {
                    Assert(pBucket->GetInitialType() == ctorCache->GetType());
                    if (!this->IsPrePass())
                    {
                        this->InsertTypeTransition(instr->m_next, objSym, pBucket, block->upwardExposedUses);
                    }
#if DBG
                    pBucket->deadStoreUnavailableInitialType = pBucket->GetInitialType();
                    if (pBucket->deadStoreUnavailableFinalType == nullptr)
                    {
                        pBucket->deadStoreUnavailableFinalType = pBucket->GetFinalType();
                    }
                    pBucket->SetInitialType(nullptr);
                    pBucket->SetFinalType(nullptr);
#else
                    block->stackSymToFinalType->Clear(objSym->m_id);
#endif
                    this->ClearTypeIDWithFinalType(objSym->m_id, block);
                }
            }

            if (block->stackSymToGuardedProperties != nullptr)
            {
                ObjTypeGuardBucket* bucket = block->stackSymToGuardedProperties->Get(objSym->m_id);
                if (bucket != nullptr)
                {
                    BVSparse<JitArenaAllocator>* guardedPropertyOps = bucket->GetGuardedPropertyOps();
                    if (guardedPropertyOps != nullptr)
                    {
                        ctorCache->EnsureGuardedPropOps(this->func->m_alloc);
                        ctorCache->AddGuardedPropOps(guardedPropertyOps);

                        bucket->SetGuardedPropertyOps(nullptr);
                        JitAdelete(this->tempAlloc, guardedPropertyOps);
                        block->stackSymToGuardedProperties->Clear(objSym->m_id);
                    }
                }
            }
        }
        else
        {
            // If the object is not used downstream, let's remove the bailout and let the lowerer emit a fast path along with
            // the fallback on helper, if the ctor cache ever became invalid.
            instr->ClearBailOutInfo();
            if (preOpBailOutInstrToProcess == instr)
            {
                preOpBailOutInstrToProcess = nullptr;
            }

#if DBG
            // We're creating a brand new object here, so no type check upstream could protect any properties of this
            // object. Let's make sure we don't have any left to protect.
            ObjTypeGuardBucket* bucket = block->stackSymToGuardedProperties != nullptr ?
                block->stackSymToGuardedProperties->Get(objSym->m_id) : nullptr;
            Assert(bucket == nullptr || bucket->GetGuardedPropertyOps()->IsEmpty());
#endif
        }
    }
}